

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

FrameOpResult __thiscall QRhi::endOffscreenFrame(QRhi *this,EndFrameFlags flags)

{
  FrameOpResult FVar1;
  undefined4 in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  FrameOpResult r;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char local_30 [36];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  if ((*(byte *)(*(long *)&in_RDI->context + 0x18) & 1) == 0) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QMessageLogger::warning
              (local_30,"Attempted to call endOffscreenFrame() without an active frame; ignored");
  }
  if ((*(byte *)(*(long *)&in_RDI->context + 0x18) & 1) == 0) {
    FVar1 = FrameOpSuccess;
  }
  else {
    FVar1 = (**(code **)(**(long **)&in_RDI->context + 0x90))(*(long **)&in_RDI->context,local_c);
  }
  *(undefined1 *)(*(long *)&in_RDI->context + 0x18) = 0;
  qDeleteAll<QSet<QRhiResource*>>((QSet<QRhiResource_*> *)CONCAT44(FVar1,in_stack_ffffffffffffffb8))
  ;
  QSet<QRhiResource_*>::clear((QSet<QRhiResource_*> *)0x698618);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return FVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRhi::FrameOpResult QRhi::endOffscreenFrame(EndFrameFlags flags)
{
    if (!d->inFrame)
        qWarning("Attempted to call endOffscreenFrame() without an active frame; ignored");

    QRhi::FrameOpResult r = d->inFrame ? d->endOffscreenFrame(flags) : FrameOpSuccess;
    d->inFrame = false;
    qDeleteAll(d->pendingDeleteResources);
    d->pendingDeleteResources.clear();

    return r;
}